

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall ON_BoolValue::ReportHelper(ON_BoolValue *this,ON_TextLog *text_log)

{
  int iVar1;
  bool *pbVar2;
  char *format;
  int local_1c;
  int count;
  int i;
  ON_TextLog *text_log_local;
  ON_BoolValue *this_local;
  
  iVar1 = ON_SimpleArray<bool>::Count(&this->m_value);
  ON_TextLog::Print(text_log,"bool value\n");
  ON_TextLog::PushIndent(text_log);
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    pbVar2 = ON_SimpleArray<bool>::operator[](&this->m_value,local_1c);
    format = "false";
    if ((*pbVar2 & 1U) != 0) {
      format = "true";
    }
    ON_TextLog::Print(text_log,format);
  }
  ON_TextLog::PopIndent(text_log);
  return true;
}

Assistant:

bool ON_BoolValue::ReportHelper(ON_TextLog& text_log ) const
{
  int i, count = m_value.Count();
  text_log.Print("bool value\n");
  text_log.PushIndent();
  for ( i = 0; i < count; i++ )
  {
    text_log.Print(m_value[i]?"true":"false");
  }
  text_log.PopIndent();
  return true;
}